

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_0::DeleteEmptyUnknownFieldSet(void)

{
  UnknownFieldSet *pUVar1;
  
  pUVar1 = (anonymous_namespace)::empty_unknown_field_set_;
  if ((anonymous_namespace)::empty_unknown_field_set_ != (UnknownFieldSet *)0x0) {
    UnknownFieldSet::~UnknownFieldSet((anonymous_namespace)::empty_unknown_field_set_);
    operator_delete(pUVar1,8);
  }
  (anonymous_namespace)::empty_unknown_field_set_ = (UnknownFieldSet *)0x0;
  return;
}

Assistant:

void DeleteEmptyUnknownFieldSet() {
  delete empty_unknown_field_set_;
  empty_unknown_field_set_ = NULL;
}